

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O0

int main(void)

{
  Box<float> *this;
  allocator<std::vector<Node_*,_std::allocator<Node_*>_>_> *this_00;
  anon_class_16_2_198ab78e __gen;
  bool bVar1;
  size_type sVar2;
  reference this_01;
  ostream *poVar3;
  rep rVar4;
  iterator iVar5;
  iterator iVar6;
  reference rVar7;
  _Bit_iterator __first;
  _Bit_iterator __last;
  undefined1 local_248 [8];
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections3;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections2;
  duration<long,_std::ratio<1L,_1000000L>_> local_210;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_208;
  duration<long,_std::ratio<1L,_1000000000L>_> local_200;
  type duration1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f0;
  type duration2;
  reference local_1d0;
  reference local_1c0;
  Node *node_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Node,_std::allocator<Node>_> *__range1_2;
  time_point start2;
  undefined1 local_190 [8];
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  intersections1;
  reference local_170;
  reference local_160;
  Node *node_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Node,_std::allocator<Node>_> *__range1_1;
  allocator<bool> local_ea;
  bool local_e9;
  undefined1 local_e8 [8];
  vector<bool,_std::allocator<bool>_> removed;
  uniform_int_distribution<int> deathDistribution;
  default_random_engine generator;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node,_std::allocator<Node>_> *__range1;
  time_point start1;
  equal_to<Node_*> local_69;
  undefined1 local_68 [8];
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  quadtree;
  vector<Node,_std::allocator<Node>_> nodes;
  Box<float> box;
  anon_class_1_0_00000001_for_mGetBox getBox;
  size_t n;
  
  stack0xffffffffffffffe8 = 1000;
  this = (Box<float> *)
         ((long)&nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4);
  ::quadtree::Box<float>::Box(this,0.0,0.0,1.0,1.0);
  generateRandomNodes((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18,
                      stack0xffffffffffffffe8);
  ::quadtree::
  Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
  ::Quadtree((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *)local_68,this,(anon_class_1_0_00000001_for_mGetBox *)((long)&box.width + 3),
             &local_69);
  __range1 = (vector<Node,_std::allocator<Node>_> *)std::chrono::_V2::steady_clock::now();
  __end1 = std::vector<Node,_std::allocator<Node>_>::begin
                     ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  node = (Node *)std::vector<Node,_std::allocator<Node>_>::end
                           ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>
                                     *)&node), bVar1) {
    generator._M_x =
         (unsigned_long)
         __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator*
                   (&__end1);
    ::quadtree::
    Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
    ::add((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *)local_68,(Node **)&generator);
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&__end1);
  }
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &deathDistribution);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             &removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,0,1);
  sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                    ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  local_e9 = false;
  std::allocator<bool>::allocator(&local_ea);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_e8,sVar2,&local_e9,&local_ea);
  std::allocator<bool>::~allocator(&local_ea);
  iVar5 = std::begin<std::vector<bool,std::allocator<bool>>>
                    ((vector<bool,_std::allocator<bool>_> *)local_e8);
  iVar6 = std::end<std::vector<bool,std::allocator<bool>>>
                    ((vector<bool,_std::allocator<bool>_> *)local_e8);
  __gen.deathDistribution =
       (uniform_int_distribution<int> *)
       &removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage;
  __gen.generator = (default_random_engine *)&deathDistribution;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
  __first.super__Bit_iterator_base._M_offset = SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar6.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar6.super__Bit_iterator_base._0_12_,8);
  std::generate<std::_Bit_iterator,main::__1>(__first,__last,__gen);
  __end1_1 = std::vector<Node,_std::allocator<Node>_>::begin
                       ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  node_1 = (Node *)std::vector<Node,_std::allocator<Node>_>::end
                             ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> *)
                       &node_1);
    if (!bVar1) break;
    local_160 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
                operator*(&__end1_1);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_e8,local_160->id);
    local_170 = rVar7;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_170);
    if (bVar1) {
      intersections1.
      super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_160;
      ::quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::remove((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                *)local_68,
               (char *)&intersections1.
                        super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&__end1_1);
  }
  sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                    ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  this_00 = (allocator<std::vector<Node_*,_std::allocator<Node_*>_>_> *)((long)&start2.__d.__r + 7);
  std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>::allocator(this_00);
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
            *)local_190,sVar2,this_00);
  std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>::~allocator
            ((allocator<std::vector<Node_*,_std::allocator<Node_*>_>_> *)((long)&start2.__d.__r + 7)
            );
  __range1_2 = (vector<Node,_std::allocator<Node>_> *)std::chrono::_V2::steady_clock::now();
  __end1_2 = std::vector<Node,_std::allocator<Node>_>::begin
                       ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  node_2 = (Node *)std::vector<Node,_std::allocator<Node>_>::end
                             ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> *)
                       &node_2);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
                operator*(&__end1_2);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_e8,local_1c0->id);
    local_1d0 = rVar7;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_1d0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ::quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::query((vector<Node_*,_std::allocator<Node_*>_> *)&duration2,
              (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
               *)local_68,&local_1c0->box);
      this_01 = std::
                vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                ::operator[]((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                              *)local_190,local_1c0->id);
      std::vector<Node_*,_std::allocator<Node_*>_>::operator=
                (this_01,(vector<Node_*,_std::allocator<Node_*>_> *)&duration2);
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)&duration2);
    }
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&__end1_2);
  }
  duration1.__r = std::chrono::_V2::steady_clock::now();
  local_1f0.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&duration1,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1_2);
  local_208.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_200.__r =
       (rep)std::chrono::operator-
                      (&local_208,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1);
  poVar3 = std::operator<<((ostream *)&std::cout,"quadtree: ");
  local_210.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_1f0);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_210);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  poVar3 = std::operator<<(poVar3,"us");
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"quadtree with creation: ");
  intersections2.
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_200);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)
                     &intersections2.
                      super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  poVar3 = std::operator<<(poVar3,"us");
  std::operator<<(poVar3,'\n');
  computeIntersections
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             &intersections3.
              super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18,
             (vector<bool,_std::allocator<bool>_> *)local_e8);
  ::quadtree::
  Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
  ::findAllIntersections
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             local_248,
             (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *)local_68);
  sVar2 = std::vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::size
                    ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                      *)local_248);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  std::operator<<(poVar3,'\n');
  sVar2 = std::vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::size
                    ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                      *)&intersections3.
                         super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  std::operator<<(poVar3,'\n');
  std::vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::~vector
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             local_248);
  std::vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::~vector
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             &intersections3.
              super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::~vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
             *)local_190);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_e8)
  ;
  ::quadtree::
  Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
  ::~Quadtree((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
               *)local_68);
  std::vector<Node,_std::allocator<Node>_>::~vector
            ((vector<Node,_std::allocator<Node>_> *)&quadtree.field_0x18);
  return 0;
}

Assistant:

int main()
{
    auto n = std::size_t(1000);
    auto getBox = [](Node* node)
    {
        return node->box;
    };
    auto box = Box(0.0f, 0.0f, 1.0f, 1.0f);
    auto nodes = generateRandomNodes(n);
    // Add nodes to quadtree
    auto quadtree = Quadtree<Node*, decltype(getBox)>(box, getBox);
    auto start1 = std::chrono::steady_clock::now();
    for (auto& node : nodes)
        quadtree.add(&node);
    // Randomly remove some nodes
    auto generator = std::default_random_engine();
    auto deathDistribution = std::uniform_int_distribution(0, 1);
    auto removed = std::vector<bool>(nodes.size(), false);
    std::generate(std::begin(removed), std::end(removed),
        [&generator, &deathDistribution](){ return deathDistribution(generator); });
    for (auto& node : nodes)
    {
        if (removed[node.id])
            quadtree.remove(&node);
    }
    // Quadtree
    auto intersections1 = std::vector<std::vector<Node*>>(nodes.size());
    auto start2 = std::chrono::steady_clock::now();
    for (const auto& node : nodes)
    {
        if (!removed[node.id])
            intersections1[node.id] = quadtree.query(node.box);
    }
    auto duration2 = std::chrono::steady_clock::now() - start2;
    auto duration1 = std::chrono::steady_clock::now() - start1;
    std::cout << "quadtree: " << std::chrono::duration_cast<std::chrono::microseconds>(duration2).count() << "us" << '\n';
    std::cout << "quadtree with creation: " << std::chrono::duration_cast<std::chrono::microseconds>(duration1).count() << "us" << '\n';
    // Brute force
    auto intersections2 = computeIntersections(nodes, removed);
    // Check
    //checkIntersections(intersections1[node.id], intersections2[node.id]);
    // Find all intersections
    auto intersections3 = quadtree.findAllIntersections();
    std::cout << intersections3.size() << '\n';
    std::cout << intersections2.size() << '\n';

    return 0;
}